

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> * __thiscall
helics::FederateState::getSubscribers
          (vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
           *__return_storage_ptr__,FederateState *this,InterfaceHandle handle)

{
  pointer pSVar1;
  PublicationInfo *pPVar2;
  SubscriberInformation *sub;
  pointer __args;
  
  sleeplock(this);
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar2 = InterfaceInfo::getPublication(&this->interfaceInformation,handle);
  if (pPVar2 != (PublicationInfo *)0x0) {
    pSVar1 = (pPVar2->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (pPVar2->subscribers).
                  super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pSVar1; __args = __args + 1)
    {
      std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
      emplace_back<helics::GlobalHandle_const&>
                ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                 __return_storage_ptr__,&__args->id);
    }
  }
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return __return_storage_ptr__;
}

Assistant:

std::vector<GlobalHandle> FederateState::getSubscribers(InterfaceHandle handle)
{
    const std::lock_guard<FederateState> fedlock(*this);
    std::vector<GlobalHandle> subs;
    auto* pubInfo = interfaceInformation.getPublication(handle);
    if (pubInfo != nullptr) {
        for (const auto& sub : pubInfo->subscribers) {
            subs.emplace_back(sub.id);
        }
    }
    return subs;
}